

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O3

bool __thiscall
draco::MetadataDecoder::DecodeGeometryMetadata
          (MetadataDecoder *this,DecoderBuffer *in_buffer,GeometryMetadata *metadata)

{
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> this_00;
  bool bVar1;
  AttributeMetadata *metadata_00;
  _Rb_tree_header *p_Var2;
  pointer *__ptr;
  uint uVar3;
  uint32_t att_unique_id;
  uint32_t num_att_metadata;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_48;
  uint32_t local_40;
  uint local_3c;
  AttributeMetadata *local_38;
  
  if (metadata != (GeometryMetadata *)0x0) {
    this->buffer_ = in_buffer;
    local_3c = 0;
    bVar1 = anon_unknown_7::DecodeVarintUnsigned<unsigned_int>(1,&local_3c,in_buffer);
    if (bVar1) {
      if (local_3c != 0) {
        uVar3 = local_3c;
        do {
          bVar1 = anon_unknown_7::DecodeVarintUnsigned<unsigned_int>(1,&local_40,this->buffer_);
          if (!bVar1) {
            return false;
          }
          metadata_00 = (AttributeMetadata *)operator_new(0x68);
          p_Var2 = &(metadata_00->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header;
          (metadata_00->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_color = _S_red;
          (metadata_00->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_parent = (_Base_ptr)0x0;
          (metadata_00->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_left = &p_Var2->_M_header;
          (metadata_00->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_right = &p_Var2->_M_header;
          (metadata_00->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_node_count =
               0;
          p_Var2 = &(metadata_00->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header;
          (metadata_00->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_color = _S_red;
          (metadata_00->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_parent = (_Base_ptr)0x0;
          (metadata_00->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_left = &p_Var2->_M_header;
          (metadata_00->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_right = &p_Var2->_M_header;
          (metadata_00->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header.
          _M_node_count = 0;
          metadata_00->att_unique_id_ = local_40;
          local_38 = metadata_00;
          bVar1 = DecodeMetadata(this,(Metadata *)metadata_00);
          if (!bVar1) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
            ::~_Rb_tree(&(metadata_00->super_Metadata).sub_metadatas_._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                         *)metadata_00);
            operator_delete(metadata_00,0x68);
            return false;
          }
          local_48._M_head_impl = metadata_00;
          GeometryMetadata::AddAttributeMetadata
                    (metadata,(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                               *)&local_48);
          this_00._M_head_impl = local_48._M_head_impl;
          if (local_48._M_head_impl != (AttributeMetadata *)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
            ::~_Rb_tree(&((local_48._M_head_impl)->super_Metadata).sub_metadatas_._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                         *)this_00._M_head_impl);
            operator_delete(this_00._M_head_impl,0x68);
          }
          local_48._M_head_impl = (AttributeMetadata *)0x0;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      bVar1 = DecodeMetadata(this,&metadata->super_Metadata);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool MetadataDecoder::DecodeGeometryMetadata(DecoderBuffer *in_buffer,
                                             GeometryMetadata *metadata) {
  if (!metadata) {
    return false;
  }
  buffer_ = in_buffer;
  uint32_t num_att_metadata = 0;
  if (!DecodeVarint(&num_att_metadata, buffer_)) {
    return false;
  }
  // Decode attribute metadata.
  for (uint32_t i = 0; i < num_att_metadata; ++i) {
    uint32_t att_unique_id;
    if (!DecodeVarint(&att_unique_id, buffer_)) {
      return false;
    }
    std::unique_ptr<AttributeMetadata> att_metadata =
        std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
    att_metadata->set_att_unique_id(att_unique_id);
    if (!DecodeMetadata(static_cast<Metadata *>(att_metadata.get()))) {
      return false;
    }
    metadata->AddAttributeMetadata(std::move(att_metadata));
  }
  return DecodeMetadata(static_cast<Metadata *>(metadata));
}